

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O3

char * leveldb::GetLengthPrefixedSlice(char *p,char *limit,Slice *result)

{
  uint uVar1;
  byte bVar2;
  long lVar3;
  byte *pbVar4;
  uint uVar5;
  byte *pbVar6;
  uint uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if (p < limit) {
    uVar7 = (uint)(byte)*p;
    pbVar6 = (byte *)(p + 1);
    if (*p < '\0') {
      pbVar4 = (byte *)0x0;
      uVar8 = 0;
      uVar5 = 0;
      do {
        if ((0x15 < uVar5) || (limit <= pbVar6)) goto LAB_00653262;
        uVar1 = uVar5 + 7;
        uVar8 = uVar8 | (uVar7 & 0x7f) << ((byte)uVar5 & 0x1f);
        bVar2 = *pbVar6;
        uVar7 = (uint)bVar2;
        pbVar6 = pbVar6 + 1;
        uVar5 = uVar1;
      } while ((char)bVar2 < '\0');
      uVar7 = uVar7 << ((byte)uVar1 & 0x1f) | uVar8;
    }
    pbVar4 = pbVar6 + uVar7;
    if (pbVar4 <= limit) {
      result->data_ = (char *)pbVar6;
      result->size_ = (ulong)uVar7;
      goto LAB_00653262;
    }
  }
  pbVar4 = (byte *)0x0;
LAB_00653262:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return (char *)pbVar4;
  }
  __stack_chk_fail();
}

Assistant:

const char* GetLengthPrefixedSlice(const char* p, const char* limit,
                                   Slice* result) {
  uint32_t len;
  p = GetVarint32Ptr(p, limit, &len);
  if (p == nullptr) return nullptr;
  if (p + len > limit) return nullptr;
  *result = Slice(p, len);
  return p + len;
}